

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nghttp2_hd.c
# Opt level: O2

int emit_string(nghttp2_bufs *bufs,uint8_t *str,size_t len)

{
  int iVar1;
  size_t sVar2;
  size_t len_00;
  size_t n;
  uint8_t sb [16];
  
  sVar2 = nghttp2_hd_huff_encode_count(str,len);
  n = len;
  if (sVar2 < len) {
    n = sVar2;
  }
  len_00 = count_encoded_length(n,7);
  iVar1 = -0x20b;
  if (len_00 < 0x11) {
    sb[0] = (sVar2 < len) << 7;
    encode_length(sb,n,7);
    iVar1 = nghttp2_bufs_add(bufs,sb,len_00);
    if (iVar1 == 0) {
      if (sVar2 < len) {
        iVar1 = nghttp2_hd_huff_encode(bufs,str,len);
      }
      else {
        iVar1 = nghttp2_bufs_add(bufs,str,len);
      }
    }
  }
  return iVar1;
}

Assistant:

static int emit_string(nghttp2_bufs *bufs, const uint8_t *str, size_t len) {
  int rv;
  uint8_t sb[16];
  uint8_t *bufp;
  size_t blocklen;
  size_t enclen;
  int huffman = 0;

  enclen = nghttp2_hd_huff_encode_count(str, len);

  if (enclen < len) {
    huffman = 1;
  } else {
    enclen = len;
  }

  blocklen = count_encoded_length(enclen, 7);

  DEBUGF("deflatehd: emit string str=%.*s, length=%zu, huffman=%d, "
         "encoded_length=%zu\n",
         (int)len, (const char *)str, len, huffman, enclen);

  if (sizeof(sb) < blocklen) {
    return NGHTTP2_ERR_HEADER_COMP;
  }

  bufp = sb;
  *bufp = huffman ? 1 << 7 : 0;
  encode_length(bufp, enclen, 7);

  rv = nghttp2_bufs_add(bufs, sb, blocklen);
  if (rv != 0) {
    return rv;
  }

  if (huffman) {
    rv = nghttp2_hd_huff_encode(bufs, str, len);
  } else {
    assert(enclen == len);
    rv = nghttp2_bufs_add(bufs, str, len);
  }

  return rv;
}